

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt64(sysbvm_context_t *context,int64_t value)

{
  sysbvm_object_tuple_t *psVar1;
  
  if (value + 0x800000000000000U >> 0x3c == 0) {
    psVar1 = (sysbvm_object_tuple_t *)(value * 0x10 + 1);
  }
  else {
    psVar1 = sysbvm_context_allocateByteTuple
                       (context,*(sysbvm_tuple_t *)((long)context + (value >> 0x3f) * -8 + 0x4c0),8)
    ;
    (psVar1->field_1).pointers[0] = value;
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt64(sysbvm_context_t *context, int64_t value)
{
    if(SYSBVM_IMMEDIATE_INT_MIN <= value && value <= SYSBVM_IMMEDIATE_INT_MAX)
        return sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)value);

    uint64_t positiveValue = value >= 0 ? (uint64_t)value : (uint64_t)(-value);

    if(positiveValue <= UINT32_MAX)
    {
        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, value >= 0 ? context->roots.largePositiveIntegerType : context->roots.largeNegativeIntegerType, 4);
        result->words[0] = (uint32_t)value;
        return (sysbvm_tuple_t)result;
    }
    else
    {
        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, value >= 0 ? context->roots.largePositiveIntegerType : context->roots.largeNegativeIntegerType, 8);
        result->words[0] = (uint32_t)value;
        result->words[1] = (uint32_t)(value >> 32);
        return (sysbvm_tuple_t)result;
    }
}